

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  double dVar2;
  undefined4 *puVar3;
  double *pdVar4;
  double *pdVar5;
  ulong *puVar6;
  undefined1 auVar7 [16];
  undefined1 (*pauVar8) [16];
  undefined8 *puVar9;
  uint uVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  long lVar16;
  long *plVar17;
  char *pcVar18;
  long lVar19;
  void *ida_mem;
  SUNContext ctx;
  int indexB1;
  int indexB2;
  sunrealtype time;
  int nckp;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined4 local_f4;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined1 (*local_d8) [16];
  double local_d0;
  long *local_c8;
  undefined1 local_c0 [8];
  double local_b8;
  long local_b0;
  long local_a8;
  long *local_a0;
  long *local_98;
  undefined8 *local_90;
  long *local_88;
  long *local_80;
  undefined8 *local_78;
  double local_70;
  double local_68;
  double local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  undefined1 local_34 [4];
  
  lVar19 = 0;
  local_100 = 0;
  SUNContext_Create(0,&local_100);
  puts("\nAdjoint Sensitivity Example for Chemical Kinetics");
  puts("---------------------------------------------------------");
  puts("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0");
  puts("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0");
  puts("               y1  +  y2  +  y3 = 0\n");
  puts("Find dG/dp and d^2G/dp^2, where p=[p1,p2] for");
  puts("     G = int_t0^tB0 g(t,p,y) dt");
  puts("     g(t,p,y) = y3\n\n");
  local_d8 = (undefined1 (*) [16])malloc(0x18);
  *(undefined4 *)*local_d8 = 0x47ae147b;
  *(undefined4 *)(*local_d8 + 4) = 0x3fa47ae1;
  *(undefined4 *)(*local_d8 + 8) = 0;
  *(undefined4 *)(*local_d8 + 0xc) = 0x40c38800;
  *(undefined8 *)local_d8[1] = 0x417c9c3800000000;
  plVar11 = (long *)N_VNew_Serial(3,local_100);
  plVar12 = (long *)N_VClone(plVar11);
  puVar14 = *(undefined8 **)(*plVar11 + 0x10);
  *puVar14 = 0x3ff0000000000000;
  puVar14[1] = 0;
  puVar14[2] = 0;
  puVar3 = *(undefined4 **)(*plVar12 + 0x10);
  *puVar3 = 0x47ae147b;
  puVar3[1] = 0xbfa47ae1;
  puVar3[2] = 0x47ae147b;
  puVar3[3] = 0x3fa47ae1;
  *(undefined8 *)(puVar3 + 4) = 0;
  plVar13 = (long *)N_VNew_Serial(1,local_100);
  N_VConst(0,plVar13);
  puVar14 = (undefined8 *)N_VCloneVectorArray(2,plVar11);
  local_c8 = plVar12;
  puVar15 = (undefined8 *)N_VCloneVectorArray(2,plVar12);
  N_VConst(0,*puVar14);
  local_90 = puVar14;
  N_VConst(0,puVar14[1]);
  N_VConst(0,*puVar15);
  local_78 = puVar15;
  N_VConst(0,puVar15[1]);
  local_98 = plVar13;
  puVar14 = (undefined8 *)N_VCloneVectorArray(2,plVar13);
  do {
    N_VConst(0,puVar14[lVar19]);
    lVar19 = lVar19 + 1;
  } while (lVar19 == 1);
  local_108 = IDACreate(local_100);
  IDAInit(0,local_108,res,plVar11,local_c8);
  IDASStolerances(0xe2308c3a,0x3ddb7cdfd9d7bdbb,local_108);
  lVar19 = SUNDenseMatrix(3,3,local_100);
  if (lVar19 == 0) {
    main_cold_8();
    return 1;
  }
  lVar16 = SUNLinSol_Dense(plVar11,lVar19,local_100);
  if (lVar16 == 0) {
    main_cold_7();
    return 1;
  }
  uVar10 = IDASetLinearSolver(local_108,lVar16,lVar19);
  if ((int)uVar10 < 0) {
LAB_0010354d:
    pcVar18 = "IDASetLinearSolver";
  }
  else {
    local_e8 = (double)lVar16;
    local_e0 = (double)lVar19;
    IDASetUserData(local_108,local_d8);
    IDASetMaxNumSteps(local_108,0x5dc);
    plVar12 = local_98;
    IDAQuadInit(local_108,rhsQ,local_98);
    IDAQuadSStolerances(0xe2308c3a,0x3ddb7cdfd9d7bdbb,local_108);
    IDASetQuadErrCon(local_108,1);
    puVar9 = local_78;
    puVar15 = local_90;
    IDASensInit(local_108,2,1,resS,local_90,local_78);
    IDASensEEtolerances(local_108);
    IDASetSensErrCon(local_108,1);
    IDAQuadSensInit(local_108,rhsQS,puVar14);
    IDAQuadSensEEtolerances(local_108);
    IDASetQuadSensErrCon(local_108,1);
    IDAAdjInit(local_108,100,1);
    puts("---------------------------------------------------------");
    puts("Forward integration");
    puts("---------------------------------------------------------\n");
    IDASolveF(0,local_108,local_c0,plVar11,local_c8,1,local_34);
    IDAGetQuad(local_108,local_c0,plVar12);
    local_d0 = **(double **)(*plVar12 + 0x10);
    printf("     G:    %12.4e\n");
    IDAGetSensDky(0,local_108,0,puVar15);
    IDAGetSensDky(0,local_108,1,puVar9);
    IDAGetQuadSens(local_108,local_c0,puVar14);
    printf("   dG/dp:  %12.4e %12.4e\n",(int)**(undefined8 **)(*(long *)*puVar14 + 0x10),
           **(undefined8 **)(*(long *)puVar14[1] + 0x10));
    putchar(10);
    plVar12 = (long *)N_VNew_Serial(6,local_100);
    plVar13 = (long *)N_VClone(plVar12);
    N_VConst(0,plVar12);
    lVar19 = *(long *)(*plVar12 + 0x10);
    *(undefined8 *)(lVar19 + 0x10) = *(undefined8 *)(*(long *)(*plVar11 + 0x10) + 0x10);
    *(undefined8 *)(lVar19 + 0x28) = *(undefined8 *)(*(long *)(*(long *)*puVar15 + 0x10) + 0x10);
    N_VConst(0,plVar13);
    pdVar4 = *(double **)(*plVar11 + 0x10);
    pdVar5 = *(double **)(*plVar13 + 0x10);
    *pdVar5 = pdVar4[2] - *pdVar4;
    pdVar5[1] = pdVar4[2] - pdVar4[1];
    pdVar4 = *(double **)(*(long *)*puVar15 + 0x10);
    pdVar5[3] = pdVar4[2] - *pdVar4;
    pdVar5[4] = pdVar4[2] - pdVar4[1];
    local_a0 = (long *)N_VNew_Serial(4,local_100);
    N_VConst(0,local_a0);
    IDACreateB(local_108,&local_f8);
    local_80 = plVar13;
    IDAInitBS(0,local_108,local_f8,resBS1,plVar12,plVar13);
    IDASStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,local_108,local_f8);
    IDASetUserDataB(local_108,local_f8,local_d8);
    IDASetMaxNumStepsB(local_108,local_f8,5000);
    lVar19 = SUNDenseMatrix(6,6,local_100);
    if (lVar19 == 0) {
      main_cold_6();
      return 1;
    }
    lVar16 = SUNLinSol_Dense(plVar12,lVar19,local_100);
    if (lVar16 == 0) {
      main_cold_5();
      return 1;
    }
    uVar10 = IDASetLinearSolverB(local_108,local_f8,lVar16,lVar19);
    if (-1 < (int)uVar10) {
      local_f0 = (double)lVar19;
      local_a8 = lVar16;
      IDAQuadInitBS(local_108,local_f8,rhsQBS1,local_a0);
      plVar13 = (long *)N_VNew_Serial(6,local_100);
      plVar17 = (long *)N_VNew_Serial(6,local_100);
      N_VConst(0,plVar13);
      puVar15 = local_90;
      lVar19 = *(long *)(*plVar13 + 0x10);
      *(undefined8 *)(lVar19 + 0x10) = *(undefined8 *)(*(long *)(*plVar11 + 0x10) + 0x10);
      *(undefined8 *)(lVar19 + 0x28) =
           *(undefined8 *)(*(long *)(*(long *)local_90[1] + 0x10) + 0x10);
      N_VConst(0,plVar17);
      pdVar4 = *(double **)(*plVar11 + 0x10);
      pdVar5 = *(double **)(*plVar17 + 0x10);
      *pdVar5 = pdVar4[2] - *pdVar4;
      pdVar5[1] = pdVar4[2] - pdVar4[1];
      pdVar4 = *(double **)(*(long *)puVar15[1] + 0x10);
      pdVar5[3] = pdVar4[2] - *pdVar4;
      pdVar5[4] = pdVar4[2] - pdVar4[1];
      local_88 = (long *)N_VNew_Serial(4,local_100);
      N_VConst(0,local_88);
      IDACreateB(local_108,&local_f4);
      local_40 = plVar17;
      IDAInitBS(0,local_108,local_f4,resBS2,plVar13,plVar17);
      IDASStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,local_108,local_f4);
      IDASetUserDataB(local_108,local_f4,local_d8);
      IDASetMaxNumStepsB(local_108,local_f4,0x9c4);
      lVar19 = SUNDenseMatrix(6,6,local_100);
      if (lVar19 == 0) {
        main_cold_4();
        return 1;
      }
      lVar16 = SUNLinSol_Dense(plVar13,lVar19,local_100);
      if (lVar16 == 0) {
        main_cold_3();
        return 1;
      }
      uVar10 = IDASetLinearSolverB(local_108,local_f4,lVar16,lVar19);
      plVar17 = local_88;
      if (-1 < (int)uVar10) {
        local_b0 = lVar16;
        local_58 = plVar13;
        local_48 = plVar11;
        IDAQuadInitBS(local_108,local_f4,rhsQBS2,local_88);
        puts("---------------------------------------------------------");
        puts("Backward integration ");
        puts("---------------------------------------------------------\n");
        IDASolveB(0,local_108,1);
        plVar11 = local_a0;
        local_b8 = (double)lVar19;
        local_50 = plVar12;
        IDAGetB(local_108,local_f8,local_c0,plVar12,local_80);
        IDAGetQuadB(local_108,local_f8,local_c0,plVar11);
        IDAGetQuadB(local_108,local_f4,local_c0,plVar17);
        printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n",
               (int)**(undefined8 **)(*plVar11 + 0x10),(*(undefined8 **)(*plVar11 + 0x10))[1]);
        printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 2)\n",
               (int)**(undefined8 **)(*plVar17 + 0x10),(*(undefined8 **)(*plVar17 + 0x10))[1]);
        putchar(10);
        puts("   H = d2G/dp2:");
        puts("        (1)            (2)");
        printf("  %12.4e  %12.4e\n",(int)*(undefined8 *)(*(long *)(*plVar11 + 0x10) + 0x10),
               *(undefined8 *)(*(long *)(*plVar17 + 0x10) + 0x10));
        plVar12 = local_48;
        pauVar8 = local_d8;
        printf("  %12.4e  %12.4e\n",(int)*(undefined8 *)(*(long *)(*plVar11 + 0x10) + 0x18),
               *(undefined8 *)(*(long *)(*plVar17 + 0x10) + 0x18));
        IDAFree(&local_108);
        SUNLinSolFree(local_e8);
        SUNMatDestroy(local_e0);
        SUNLinSolFree(local_a8);
        SUNMatDestroy(local_f0);
        SUNLinSolFree(local_b0);
        SUNMatDestroy(local_b8);
        putchar(10);
        puts("---------------------------------------------------------");
        printf("Finite Differences ( dp1=%6.1e and dp2 = %6.1e )\n",0xd2f1a9fc,0x406f400000000000);
        puts("---------------------------------------------------------\n");
        local_108 = IDACreate(local_100);
        plVar11 = local_c8;
        *(double *)*pauVar8 = *(double *)*pauVar8 + 0.001;
        puVar15 = *(undefined8 **)(*plVar12 + 0x10);
        *puVar15 = 0x3ff0000000000000;
        puVar15[1] = 0;
        puVar15[2] = 0;
        uVar1 = *(ulong *)*pauVar8;
        puVar6 = *(ulong **)(*local_c8 + 0x10);
        *puVar6 = uVar1 ^ 0x8000000000000000;
        puVar6[1] = uVar1;
        puVar6[2] = 0;
        N_VConst(0,local_98);
        IDAInit(0,local_108,res,plVar12,plVar11);
        IDASStolerances(0x812dea11,0x3d06849b86a12b9b,local_108);
        lVar19 = SUNDenseMatrix(3,3,local_100);
        if (lVar19 == 0) {
          main_cold_2();
          return 1;
        }
        lVar16 = SUNLinSol_Dense(plVar12,lVar19,local_100);
        if (lVar16 == 0) {
          main_cold_1();
          return 1;
        }
        uVar10 = IDASetLinearSolver(local_108,lVar16,lVar19);
        if (-1 < (int)uVar10) {
          local_a8 = lVar16;
          IDASetUserData(local_108,pauVar8);
          IDASetMaxNumSteps(local_108,10000);
          plVar13 = local_98;
          local_b0 = lVar19;
          IDAQuadInit(local_108,rhsQ,local_98);
          IDAQuadSStolerances(0x812dea11,0x3d06849b86a12b9b,local_108);
          IDASetQuadErrCon(local_108,1);
          plVar11 = local_c8;
          IDASolve(0,local_108,local_c0,plVar12,local_c8,1);
          IDAGetQuad(local_108,local_c0,plVar13);
          local_e0 = **(double **)(*plVar13 + 0x10);
          *(double *)*pauVar8 = *(double *)*pauVar8 + -0.002;
          puVar15 = *(undefined8 **)(*plVar12 + 0x10);
          *puVar15 = 0x3ff0000000000000;
          puVar15[1] = 0;
          puVar15[2] = 0;
          uVar1 = *(ulong *)*pauVar8;
          puVar6 = *(ulong **)(*plVar11 + 0x10);
          *puVar6 = uVar1 ^ 0x8000000000000000;
          puVar6[1] = uVar1;
          puVar6[2] = 0;
          N_VConst(0,plVar13);
          IDAReInit(0,local_108,plVar12,plVar11);
          IDAQuadReInit(local_108,plVar13);
          IDASolve(0,local_108,local_c0,plVar12,plVar11,1);
          IDAGetQuad(local_108,local_c0,plVar13);
          dVar2 = **(double **)(*plVar13 + 0x10);
          local_68 = (local_e0 - local_d0) / 0.001;
          local_60 = (local_d0 - dVar2) / 0.001;
          local_b8 = (local_e0 - dVar2) / 0.002;
          local_e8 = local_d0 * -2.0;
          local_e0 = (local_e0 + local_e8 + dVar2) / 1e-06;
          dVar2 = *(double *)(*pauVar8 + 8) + 250.0;
          auVar7._8_4_ = SUB84(dVar2,0);
          auVar7._0_8_ = *(double *)*pauVar8 + 0.001;
          auVar7._12_4_ = (int)((ulong)dVar2 >> 0x20);
          *pauVar8 = auVar7;
          puVar15 = *(undefined8 **)(*plVar12 + 0x10);
          *puVar15 = 0x3ff0000000000000;
          puVar15[1] = 0;
          puVar15[2] = 0;
          uVar1 = *(ulong *)*pauVar8;
          puVar6 = *(ulong **)(*plVar11 + 0x10);
          *puVar6 = uVar1 ^ 0x8000000000000000;
          puVar6[1] = uVar1;
          puVar6[2] = 0;
          N_VConst(0,plVar13);
          IDAReInit(0,local_108,plVar12,plVar11);
          IDAQuadReInit(local_108,plVar13);
          IDASolve(0,local_108,local_c0,plVar12,plVar11,1);
          IDAGetQuad(local_108,local_c0,plVar13);
          local_f0 = **(double **)(*plVar13 + 0x10);
          *(double *)(*pauVar8 + 8) = *(double *)(*pauVar8 + 8) + -500.0;
          puVar15 = *(undefined8 **)(*plVar12 + 0x10);
          *puVar15 = 0x3ff0000000000000;
          puVar15[1] = 0;
          puVar15[2] = 0;
          uVar1 = *(ulong *)*pauVar8;
          puVar6 = *(ulong **)(*plVar11 + 0x10);
          *puVar6 = uVar1 ^ 0x8000000000000000;
          puVar6[1] = uVar1;
          puVar6[2] = 0;
          N_VConst(0,plVar13);
          IDAReInit(0,local_108,plVar12,plVar11);
          IDAQuadReInit(local_108,plVar13);
          IDASolve(0,local_108,local_c0,plVar12,plVar11,1);
          IDAGetQuad(local_108,local_c0,plVar13);
          dVar2 = **(double **)(*plVar13 + 0x10);
          local_70 = (local_f0 - local_d0) / 250.0;
          local_e8 = local_e8 + local_f0;
          local_f0 = (local_f0 - dVar2) / 500.0;
          local_d0 = (local_d0 - dVar2) / 250.0;
          local_e8 = (local_e8 + dVar2) / 62500.0;
          putchar(10);
          printf("   dG/dp:  %12.4e  %12.4e   (fwd FD)\n",SUB84(local_68,0),local_70);
          printf("           %12.4e  %12.4e   (bck FD)\n",SUB84(local_60,0),local_d0);
          printf("           %12.4e  %12.4e   (cntr FD)\n",SUB84(local_b8,0),local_f0);
          putchar(10);
          printf("  H(1,1):  %12.4e\n",SUB84(local_e0,0));
          printf("  H(2,2):  %12.4e\n",SUB84(local_e8,0));
          IDAFree(&local_108);
          SUNLinSolFree(local_a8);
          SUNMatDestroy(local_b0);
          N_VDestroy(local_50);
          N_VDestroy(local_80);
          N_VDestroy(local_a0);
          N_VDestroy(local_58);
          N_VDestroy(local_40);
          N_VDestroy(local_88);
          N_VDestroy(plVar12);
          N_VDestroy(plVar11);
          N_VDestroy(plVar13);
          N_VDestroyVectorArray(local_90,2);
          N_VDestroyVectorArray(local_78,2);
          N_VDestroyVectorArray(puVar14,2);
          free(local_d8);
          SUNContext_Free(&local_100);
          return 0;
        }
        goto LAB_0010354d;
      }
    }
    pcVar18 = "IDASetLinearSolverB";
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar18,(ulong)uVar10);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  N_Vector yy, yp, q, *yyS, *ypS, *qS;
  N_Vector yyB1, ypB1, qB1, yyB2, ypB2, qB2;
  void* ida_mem;
  UserData data;
  sunrealtype time, ti, tf;
  int retval, nckp, indexB1, indexB2, is;
  sunrealtype G, Gm, Gp, dp1, dp2, grdG_fwd[2], grdG_bck[2], grdG_cntr[2], H11,
    H22;
  sunrealtype rtolFD, atolFD;
  SUNMatrix A, AB1, AB2;
  SUNLinearSolver LS, LSB1, LSB2;

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext ctx = NULL;
  SUNContext_Create(SUN_COMM_NULL, &ctx);

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("---------------------------------------------------------\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp and d^2G/dp^2, where p=[p1,p2] for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* Alocate and initialize user data. */
  data       = (UserData)malloc(sizeof(*data));
  data->p[0] = P1;
  data->p[1] = P2;
  data->p[2] = P3;

  /* Consistent IC */
  yy         = N_VNew_Serial(NEQ, ctx);
  yp         = N_VClone(yy);
  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -P1;
  Ith(yp, 2) = P1;
  Ith(yp, 3) = 0;

  q = N_VNew_Serial(1, ctx);
  N_VConst(ZERO, q);

  yyS = N_VCloneVectorArray(NP, yy);
  ypS = N_VCloneVectorArray(NP, yp);
  N_VConst(ZERO, yyS[0]);
  N_VConst(ZERO, yyS[1]);
  N_VConst(ZERO, ypS[0]);
  N_VConst(ZERO, ypS[1]);

  qS = N_VCloneVectorArray(NP, q);
  for (is = 0; is < NP; is++) { N_VConst(ZERO, qS[is]); }

  ida_mem = IDACreate(ctx);

  ti     = T0;
  retval = IDAInit(ida_mem, res, ti, yy, yp);

  /* Forward problem's setup. */
  retval = IDASStolerances(ida_mem, RTOL, ATOL);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  retval = IDASetMaxNumSteps(ida_mem, 1500);

  /* Quadrature's setup. */
  retval = IDAQuadInit(ida_mem, rhsQ, q);
  retval = IDAQuadSStolerances(ida_mem, RTOL, ATOL);
  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);

  /* Sensitivity's setup. */
  retval = IDASensInit(ida_mem, NP, IDA_SIMULTANEOUS, resS, yyS, ypS);
  retval = IDASensEEtolerances(ida_mem);
  retval = IDASetSensErrCon(ida_mem, SUNTRUE);

  /* Setup of quadrature's sensitivities */
  retval = IDAQuadSensInit(ida_mem, rhsQS, qS);
  retval = IDAQuadSensEEtolerances(ida_mem);
  retval = IDASetQuadSensErrCon(ida_mem, SUNTRUE);

  /* Initialize ASA. */
  retval = IDAAdjInit(ida_mem, 100, IDA_HERMITE);

  printf("---------------------------------------------------------\n");
  printf("Forward integration\n");
  printf("---------------------------------------------------------\n\n");

  tf     = TF;
  retval = IDASolveF(ida_mem, tf, &time, yy, yp, IDA_NORMAL, &nckp);

  IDAGetQuad(ida_mem, &time, q);
  G = Ith(q, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("     G:    %12.4Le\n", G);
#else
  printf("     G:    %12.4e\n", G);
#endif

  /* Sensitivities are needed for IC of backward problems. */
  IDAGetSensDky(ida_mem, tf, 0, yyS);
  IDAGetSensDky(ida_mem, tf, 1, ypS);

  IDAGetQuadSens(ida_mem, &time, qS);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(qS[0], 1), Ith(qS[1], 1));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(qS[0], 1), Ith(qS[1], 1));
#endif
  printf("\n");
  /******************************
  * BACKWARD PROBLEM #1
  *******************************/

  /* Consistent IC. */
  yyB1 = N_VNew_Serial(2 * NEQ, ctx);
  ypB1 = N_VClone(yyB1);

  N_VConst(ZERO, yyB1);
  Ith(yyB1, 3) = Ith(yy, 3);
  Ith(yyB1, 6) = Ith(yyS[0], 3);

  N_VConst(ZERO, ypB1);
  Ith(ypB1, 1) = Ith(yy, 3) - Ith(yy, 1);
  Ith(ypB1, 2) = Ith(yy, 3) - Ith(yy, 2);
  Ith(ypB1, 4) = Ith(yyS[0], 3) - Ith(yyS[0], 1);
  Ith(ypB1, 5) = Ith(yyS[0], 3) - Ith(yyS[0], 2);

  qB1 = N_VNew_Serial(2 * NP, ctx);
  N_VConst(ZERO, qB1);

  retval = IDACreateB(ida_mem, &indexB1);
  retval = IDAInitBS(ida_mem, indexB1, resBS1, tf, yyB1, ypB1);
  retval = IDASStolerancesB(ida_mem, indexB1, RTOLA, ATOLA);
  retval = IDASetUserDataB(ida_mem, indexB1, data);
  retval = IDASetMaxNumStepsB(ida_mem, indexB1, 5000);

  /* Create dense SUNMatrix for use in linear solves */
  AB1 = SUNDenseMatrix(2 * NEQ, 2 * NEQ, ctx);
  if (check_retval((void*)AB1, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB1 = SUNLinSol_Dense(yyB1, AB1, ctx);
  if (check_retval((void*)LSB1, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB1, LSB1, AB1);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  retval = IDAQuadInitBS(ida_mem, indexB1, rhsQBS1, qB1);

  /******************************
  * BACKWARD PROBLEM #2
  *******************************/

  /* Consistent IC. */
  yyB2 = N_VNew_Serial(2 * NEQ, ctx);
  ypB2 = N_VNew_Serial(2 * NEQ, ctx);

  N_VConst(ZERO, yyB2);
  Ith(yyB2, 3) = Ith(yy, 3);
  Ith(yyB2, 6) = Ith(yyS[1], 3);

  N_VConst(ZERO, ypB2);
  Ith(ypB2, 1) = Ith(yy, 3) - Ith(yy, 1);
  Ith(ypB2, 2) = Ith(yy, 3) - Ith(yy, 2);
  Ith(ypB2, 4) = Ith(yyS[1], 3) - Ith(yyS[1], 1);
  Ith(ypB2, 5) = Ith(yyS[1], 3) - Ith(yyS[1], 2);

  qB2 = N_VNew_Serial(2 * NP, ctx);
  N_VConst(ZERO, qB2);

  retval = IDACreateB(ida_mem, &indexB2);
  retval = IDAInitBS(ida_mem, indexB2, resBS2, tf, yyB2, ypB2);
  retval = IDASStolerancesB(ida_mem, indexB2, RTOLA, ATOLA);
  retval = IDASetUserDataB(ida_mem, indexB2, data);
  retval = IDASetMaxNumStepsB(ida_mem, indexB2, 2500);

  /* Create dense SUNMatrix for use in linear solves */
  AB2 = SUNDenseMatrix(2 * NEQ, 2 * NEQ, ctx);
  if (check_retval((void*)AB2, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB2 = SUNLinSol_Dense(yyB2, AB2, ctx);
  if (check_retval((void*)LSB2, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB2, LSB2, AB2);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  retval = IDAQuadInitBS(ida_mem, indexB2, rhsQBS2, qB2);

  /* Integrate backward problems. */
  printf("---------------------------------------------------------\n");
  printf("Backward integration \n");
  printf("---------------------------------------------------------\n\n");

  retval = IDASolveB(ida_mem, ti, IDA_NORMAL);

  retval = IDAGetB(ida_mem, indexB1, &time, yyB1, ypB1);
  /*
     retval = IDAGetNumSteps(IDAGetAdjIDABmem(ida_mem, indexB1), &nst);
     printf("at time=%g \tpb 1 Num steps:%d\n", time, nst);
     retval = IDAGetNumSteps(IDAGetAdjIDABmem(ida_mem, indexB2), &nst);
     printf("at time=%g \tpb 2 Num steps:%d\n\n", time, nst);
  */

  retval = IDAGetQuadB(ida_mem, indexB1, &time, qB1);
  retval = IDAGetQuadB(ida_mem, indexB2, &time, qB2);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 1)\n", Ith(qB1, 1),
         Ith(qB1, 2));
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 2)\n", Ith(qB2, 1),
         Ith(qB2, 2));
#else
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n", Ith(qB1, 1),
         Ith(qB1, 2));
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 2)\n", Ith(qB2, 1),
         Ith(qB2, 2));
#endif

  printf("\n");
  printf("   H = d2G/dp2:\n");
  printf("        (1)            (2)\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  %12.4Le  %12.4Le\n", Ith(qB1, 3), Ith(qB2, 3));
  printf("  %12.4Le  %12.4Le\n", Ith(qB1, 4), Ith(qB2, 4));
#else
  printf("  %12.4e  %12.4e\n", Ith(qB1, 3), Ith(qB2, 3));
  printf("  %12.4e  %12.4e\n", Ith(qB1, 4), Ith(qB2, 4));
#endif

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB1);
  SUNMatDestroy(AB1);
  SUNLinSolFree(LSB2);
  SUNMatDestroy(AB2);

  /*********************************
  * Use Finite Differences to verify
  **********************************/

  /* Perturbations are of different magnitudes as p1 and p2 are. */
  dp1 = SUN_RCONST(1.0e-3);
  dp2 = SUN_RCONST(2.5e+2);

  printf("\n");
  printf("---------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Finite Differences ( dp1=%6.1Le and dp2 = %6.1Le )\n", dp1, dp2);
#else
  printf("Finite Differences ( dp1=%6.1e and dp2 = %6.1e )\n", dp1, dp2);
#endif
  printf("---------------------------------------------------------\n\n");

  ida_mem = IDACreate(ctx);

  /********************
  * Forward FD for p1
  ********************/
  data->p[0] += dp1;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);
  ti = T0;
  tf = TF;

  retval = IDAInit(ida_mem, res, ti, yy, yp);

  rtolFD = SUN_RCONST(1.0e-12);
  atolFD = SUN_RCONST(1.0e-14);

  retval = IDASStolerances(ida_mem, rtolFD, atolFD);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  retval = IDASetMaxNumSteps(ida_mem, 10000);

  retval = IDAQuadInit(ida_mem, rhsQ, q);
  retval = IDAQuadSStolerances(ida_mem, rtolFD, atolFD);
  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gp     = Ith(q, 1);

  /********************
  * Backward FD for p1
  ********************/
  data->p[0] -= 2 * dp1;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gm     = Ith(q, 1);

  /* Compute FD for p1. */
  grdG_fwd[0]  = (Gp - G) / dp1;
  grdG_bck[0]  = (G - Gm) / dp1;
  grdG_cntr[0] = (Gp - Gm) / (2.0 * dp1);
  H11          = (Gp - 2.0 * G + Gm) / (dp1 * dp1);

  /********************
  * Forward FD for p2
  ********************/
  /*restore p1*/
  data->p[0] += dp1;
  data->p[1] += dp2;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gp     = Ith(q, 1);

  /********************
  * Backward FD for p2
  ********************/
  data->p[1] -= 2 * dp2;

  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;
  Ith(yp, 1) = -data->p[0];
  Ith(yp, 2) = -Ith(yp, 1);
  Ith(yp, 3) = 0;
  N_VConst(ZERO, q);

  retval = IDAReInit(ida_mem, ti, yy, yp);
  retval = IDAQuadReInit(ida_mem, q);

  retval = IDASolve(ida_mem, tf, &time, yy, yp, IDA_NORMAL);
  retval = IDAGetQuad(ida_mem, &time, q);
  Gm     = Ith(q, 1);

  /* Compute FD for p2. */
  grdG_fwd[1]  = (Gp - G) / dp2;
  grdG_bck[1]  = (G - Gm) / dp2;
  grdG_cntr[1] = (Gp - Gm) / (2.0 * dp2);
  H22          = (Gp - 2.0 * G + Gm) / (dp2 * dp2);

  printf("\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le  %12.4Le   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4Le  %12.4Le   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4Le  %12.4Le   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4Le\n", H11);
  printf("  H(2,2):  %12.4Le\n", H22);
#else
  printf("   dG/dp:  %12.4e  %12.4e   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4e  %12.4e   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4e  %12.4e   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4e\n", H11);
  printf("  H(2,2):  %12.4e\n", H22);
#endif

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(yyB1);
  N_VDestroy(ypB1);
  N_VDestroy(qB1);

  N_VDestroy(yyB2);
  N_VDestroy(ypB2);
  N_VDestroy(qB2);

  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  N_VDestroyVectorArray(yyS, NP);
  N_VDestroyVectorArray(ypS, NP);
  N_VDestroyVectorArray(qS, NP);

  free(data);

  SUNContext_Free(&ctx);
  return 0;
}